

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyFormatter.h
# Opt level: O0

basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
          (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this,char **s)

{
  char **s_local;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *this_local;
  
  std::operator<<((ostream *)this,*s);
  return (basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
}

Assistant:

basic_formatter& operator << (const TToken& s) {
        underlying << s;
        return *this;
    }